

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O0

double anon_unknown.dwarf_28dc8::I0(double x,int upper_limit,double eps)

{
  double dVar1;
  int i;
  double prev_sum;
  double sum;
  double z;
  double y;
  double eps_local;
  int upper_limit_local;
  double x_local;
  
  z = 1.0;
  sum = 1.0;
  i = 1;
  while( true ) {
    if (upper_limit <= i) {
      return sum;
    }
    z = ((x * 0.5) / (double)i) * z;
    dVar1 = z * z + sum;
    if (dVar1 - sum < eps) break;
    i = i + 1;
    sum = dVar1;
  }
  return dVar1;
}

Assistant:

double I0(double x, int upper_limit = 500, double eps = 1e-6) {
  const double y(0.5 * x);
  double z(1.0);
  double sum(1.0);
  double prev_sum(sum);
  for (int i(1); i < upper_limit; ++i) {
    z *= y / i;
    sum += z * z;
    if (sum - prev_sum < eps) break;
    prev_sum = sum;
  }
  return sum;
}